

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O0

bool __thiscall FM::OPNA::LoadRhythmSample(OPNA *this,char *path)

{
  bool bVar1;
  int16 *piVar2;
  int local_1084;
  int local_1080;
  uint8 subchunkname [4];
  anon_struct_24_8_03634c04 whdr;
  char local_1058 [8];
  char buf [2049];
  uint local_84c;
  undefined1 local_848 [4];
  uint32 fsize;
  FileIO file;
  int i;
  char *path_local;
  OPNA *this_local;
  
  for (file._2076_4_ = 0; (int)file._2076_4_ < 6; file._2076_4_ = file._2076_4_ + 1) {
    this->rhythm[(int)file._2076_4_].pos = 0xffffffff;
  }
  for (file._2076_4_ = 0; (int)file._2076_4_ < 6; file._2076_4_ = file._2076_4_ + 1) {
    FileIO::FileIO((FileIO *)local_848);
    memset(local_1058,0,0x801);
    if (path != (char *)0x0) {
      strncpy(local_1058,path,0x800);
    }
    strncat(local_1058,"2608_",0x800);
    strncat(local_1058,LoadRhythmSample::rhythmname[(int)file._2076_4_],0x800);
    strncat(local_1058,".wav",0x800);
    bVar1 = FileIO::Open((FileIO *)local_848,local_1058,2);
    if (bVar1) {
LAB_001fe4b3:
      FileIO::Seek((FileIO *)local_848,0x10,begin);
      FileIO::Read((FileIO *)local_848,&local_1080,0x18);
      local_84c = local_1080 - 0x14;
      do {
        FileIO::Seek((FileIO *)local_848,local_84c,current);
        FileIO::Read((FileIO *)local_848,&local_1084,4);
        FileIO::Read((FileIO *)local_848,&local_84c,4);
      } while (local_1084 != 0x61746164);
      local_84c = local_84c >> 1;
      if (((local_84c < 0x100000) && (subchunkname._0_2_ == 1)) && (subchunkname._2_2_ == 1)) {
        local_84c = Max(local_84c,-0x200000);
        if ((this->rhythm[(int)file._2076_4_].sample == (int16 *)0x0) &&
           (piVar2 = this->rhythm[(int)file._2076_4_].sample, piVar2 != (int16 *)0x0)) {
          operator_delete(piVar2);
        }
        piVar2 = (int16 *)operator_new__((ulong)local_84c * 2);
        this->rhythm[(int)file._2076_4_].sample = piVar2;
        if (this->rhythm[(int)file._2076_4_].sample == (int16 *)0x0) {
          whdr.align = 5;
          whdr.bps = 0;
        }
        else {
          FileIO::Read((FileIO *)local_848,this->rhythm[(int)file._2076_4_].sample,local_84c * 2);
          this->rhythm[(int)file._2076_4_].rate = whdr.chunksize;
          this->rhythm[(int)file._2076_4_].step =
               (this->rhythm[(int)file._2076_4_].rate << 10) /
               (this->super_OPNABase).super_OPNBase.rate;
          this->rhythm[(int)file._2076_4_].size = local_84c << 10;
          this->rhythm[(int)file._2076_4_].pos = local_84c << 10;
          whdr.align = 0;
          whdr.bps = 0;
        }
      }
      else {
        whdr.align = 5;
        whdr.bps = 0;
      }
    }
    else if (file._2076_4_ == 5) {
      if (path != (char *)0x0) {
        strncpy(local_1058,path,0x800);
      }
      strncpy(local_1058,"2608_rym.wav",0x800);
      bVar1 = FileIO::Open((FileIO *)local_848,local_1058,2);
      if (bVar1) goto LAB_001fe4b3;
      whdr.align = 5;
      whdr.bps = 0;
    }
    else {
      whdr.align = 5;
      whdr.bps = 0;
    }
    FileIO::~FileIO((FileIO *)local_848);
    if (whdr._16_4_ != 0) break;
  }
  if (file._2076_4_ == 6) {
    this_local._7_1_ = true;
  }
  else {
    for (file._2076_4_ = 0; (int)file._2076_4_ < 6; file._2076_4_ = file._2076_4_ + 1) {
      piVar2 = this->rhythm[(int)file._2076_4_].sample;
      if (piVar2 != (int16 *)0x0) {
        operator_delete__(piVar2);
      }
      this->rhythm[(int)file._2076_4_].sample = (int16 *)0x0;
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool OPNA::LoadRhythmSample(const char* path)
{
	static const char* rhythmname[6] =
	{
		"bd", "sd", "top", "hh", "tom", "rim",
	};

	int i;
	for (i=0; i<6; i++)
		rhythm[i].pos = ~0u;

	for (i=0; i<6; i++)
	{
		FileIO file;
		uint32 fsize;
		char buf[MAX_PATH + 1] = "";
		if (path)
			strncpy(buf, path, MAX_PATH);
		strncat(buf, "2608_", MAX_PATH);
		strncat(buf, rhythmname[i], MAX_PATH);
		strncat(buf, ".wav", MAX_PATH);

		if (!file.Open(buf, FileIO::readonly))
		{
			if (i != 5)
				break;
			if (path)
				strncpy(buf, path, MAX_PATH);
			strncpy(buf, "2608_rym.wav", MAX_PATH);
			if (!file.Open(buf, FileIO::readonly))
				break;
		}

		struct
		{
			uint32 chunksize;
			uint16 tag;
			uint16 nch;
			uint32 rate;
			uint32 avgbytes;
			uint16 align;
			uint16 bps;
			uint16 size;
		} whdr;

		file.Seek(0x10, FileIO::begin);
		file.Read(&whdr, sizeof(whdr));

		uint8 subchunkname[4];
		fsize = 4 + whdr.chunksize - sizeof(whdr);
		do
		{
			file.Seek(fsize, FileIO::current);
			file.Read(&subchunkname, 4);
			file.Read(&fsize, 4);
		} while (memcmp("data", subchunkname, 4));

		fsize /= 2;
		if (fsize >= 0x100000 || whdr.tag != 1 || whdr.nch != 1)
			break;
		fsize = Max(fsize, (1<<31)/1024);

		if(!rhythm[i].sample)
			delete rhythm[i].sample;
		rhythm[i].sample = new int16[fsize];
		if (!rhythm[i].sample)
			break;

		file.Read(rhythm[i].sample, fsize * 2);

		rhythm[i].rate = whdr.rate;
		rhythm[i].step = rhythm[i].rate * 1024 / rate;
		rhythm[i].pos = rhythm[i].size = fsize * 1024;
	}
	if (i != 6)
	{
		for (i=0; i<6; i++)
		{
			delete[] rhythm[i].sample;
			rhythm[i].sample = 0;
		}
		return false;
	}
	return true;
}